

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O1

void __thiscall
ArgsManager::AddArg(ArgsManager *this,string *name,string *help,uint flags,OptionsCategory *cat)

{
  pointer pcVar1;
  void *pvVar2;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ArgsManager::Arg>,std::_Select1st<std::pair<std::__cxx11::string_const,ArgsManager::Arg>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ArgsManager::Arg>>>
  *this_00;
  ulong uVar3;
  size_t __n;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ArgsManager::Arg>_>,_bool>
  pVar4;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock17;
  string arg_name;
  unique_lock<std::recursive_mutex> local_b0;
  undefined1 local_a0 [32];
  _Alloc_hider local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  uint local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_a0[0] = (flags >> 0xb & 1) == 0;
  inline_assertion_check<true,bool>
            ((bool *)local_a0,
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/common/args.cpp"
             ,0x236,"AddArg","(flags & ArgsManager::COMMAND) == 0");
  __n = name->_M_string_length;
  if (__n == 0) {
    uVar3 = 0xffffffffffffffff;
  }
  else {
    pcVar1 = (name->_M_dataplus)._M_p;
    pvVar2 = memchr(pcVar1,0x3d,__n);
    uVar3 = -(ulong)(pvVar2 == (void *)0x0) | (long)pvVar2 - (long)pcVar1;
  }
  if (uVar3 != 0xffffffffffffffff) {
    __n = uVar3;
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            (&local_58,name,0,__n);
  local_b0._M_owns = false;
  local_b0._M_device = (mutex_type *)this;
  std::unique_lock<std::recursive_mutex>::lock(&local_b0);
  this_00 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ArgsManager::Arg>,std::_Select1st<std::pair<std::__cxx11::string_const,ArgsManager::Arg>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ArgsManager::Arg>>>
             *)std::
               map<OptionsCategory,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ArgsManager::Arg,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ArgsManager::Arg>_>_>,_std::less<OptionsCategory>,_std::allocator<std::pair<const_OptionsCategory,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ArgsManager::Arg,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ArgsManager::Arg>_>_>_>_>_>
               ::operator[](&this->m_available_args,cat);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,name,__n,
             name->_M_string_length - __n);
  pcVar1 = (help->_M_dataplus)._M_p;
  local_80._M_p = (pointer)&local_70;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_80,pcVar1,pcVar1 + help->_M_string_length);
  local_60 = flags;
  pVar4 = std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ArgsManager::Arg>,std::_Select1st<std::pair<std::__cxx11::string_const,ArgsManager::Arg>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ArgsManager::Arg>>>
          ::_M_emplace_unique<std::__cxx11::string&,ArgsManager::Arg>
                    (this_00,&local_58,(Arg *)local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_p != &local_70) {
    operator_delete(local_80._M_p,local_70._M_allocated_capacity + 1);
  }
  if ((undefined1 *)CONCAT71(local_a0._1_7_,local_a0[0]) != local_a0 + 0x10) {
    operator_delete((undefined1 *)CONCAT71(local_a0._1_7_,local_a0[0]),local_a0._16_8_ + 1);
  }
  if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    if ((flags >> 9 & 1) != 0) {
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_emplace_unique<std::__cxx11::string&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&this->m_network_only_args,&local_58);
    }
    std::unique_lock<std::recursive_mutex>::~unique_lock(&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
    __stack_chk_fail();
  }
  __assert_fail("ret.second",
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/common/args.cpp"
                ,0x242,
                "void ArgsManager::AddArg(const std::string &, const std::string &, unsigned int, const OptionsCategory &)"
               );
}

Assistant:

void ArgsManager::AddArg(const std::string& name, const std::string& help, unsigned int flags, const OptionsCategory& cat)
{
    Assert((flags & ArgsManager::COMMAND) == 0); // use AddCommand

    // Split arg name from its help param
    size_t eq_index = name.find('=');
    if (eq_index == std::string::npos) {
        eq_index = name.size();
    }
    std::string arg_name = name.substr(0, eq_index);

    LOCK(cs_args);
    std::map<std::string, Arg>& arg_map = m_available_args[cat];
    auto ret = arg_map.emplace(arg_name, Arg{name.substr(eq_index, name.size() - eq_index), help, flags});
    assert(ret.second); // Make sure an insertion actually happened

    if (flags & ArgsManager::NETWORK_ONLY) {
        m_network_only_args.emplace(arg_name);
    }
}